

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O0

void __thiscall
pstore::basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits>::do_rollover
          (basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this)

{
  bool bVar1;
  int in_ESI;
  basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits> local_68 [32];
  string *local_48;
  string *dest;
  string *local_20;
  string *source;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *pbStack_10;
  uint index;
  basic_rotating_log<pstore::fstream_traits,_pstore::file_system_traits> *this_local;
  
  pbStack_10 = this;
  close(this,in_ESI);
  for (source._4_4_ = this->num_backups_; source._4_4_ != 0; source._4_4_ = source._4_4_ - 1) {
    basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>::make_file_name_abi_cxx11_
              ((basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits> *)&dest,
               (uint)this);
    local_20 = (string *)&dest;
    basic_rotating_log<pstore::fstream_traits,pstore::file_system_traits>::make_file_name_abi_cxx11_
              (local_68,(uint)this);
    local_48 = (string *)local_68;
    bVar1 = file_system_traits::exists(local_20);
    if (bVar1) {
      bVar1 = file_system_traits::exists(local_48);
      if (bVar1) {
        file_system_traits::unlink((char *)local_48);
      }
      file_system_traits::rename((char *)local_20,(char *)local_48);
    }
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&dest);
  }
  fstream_traits::clear(&this->stream_);
  return;
}

Assistant:

void basic_rotating_log<StreamTraits, FileSystemTraits>::do_rollover () {
        this->close ();

        for (auto index = num_backups_; index > 0; --index) {
            std::string const & source = this->make_file_name (index - 1);
            std::string const & dest = this->make_file_name (index);
            if (file_system_traits_.exists (source)) {
                if (file_system_traits_.exists (dest)) {
                    file_system_traits_.unlink (dest);
                }
                // TODO: compress the old files rather than simply rename them?
                file_system_traits_.rename (source, dest);
            }
        }

        // Clear the stream contents. Not an issue if we're really using files (because we're
        // using a different file) but, for example, writing to a single ostringstream we'll
        // need to clear the output stream.
        stream_traits_.clear (stream_);
    }